

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaDynAr.h
# Opt level: O1

int __thiscall NaDynAr<char_*>::addh(NaDynAr<char_*> *this,char **pobj)

{
  int iVar1;
  item *piVar2;
  undefined4 *puVar3;
  item **ppiVar4;
  bool bVar5;
  
  if (pobj != (char **)0x0) {
    piVar2 = (item *)operator_new(0x10);
    piVar2->pData = pobj;
    piVar2->pNext = (item *)0x0;
    bVar5 = this->pHead != (item *)0x0;
    ppiVar4 = &this->pTail->pNext;
    if (!bVar5) {
      ppiVar4 = &this->pTail;
    }
    *ppiVar4 = piVar2;
    (&this->pHead)[bVar5] = piVar2;
    iVar1 = this->nItems;
    this->nItems = iVar1 + 1;
    return iVar1;
  }
  puVar3 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar3 = 0;
  __cxa_throw(puVar3,&NaException::typeinfo,0);
}

Assistant:

virtual int	addh (type* pobj) {
    if(NULL == pobj)
      throw(na_null_pointer);

    item	*p = new item(pobj);

#ifdef DynAr_DEBUG
    NaPrintLog("DynAr::addh(this=0x%08p), %d items, new item=0x%08p\n",
	       this, nItems, p);
#endif /* DynAr_DEBUG */

    if(NULL == pHead){
      pHead = pTail = p;
    }
    else{
      pTail->pNext = p;
      pTail = p;
    }
    ++nItems;

    return nItems - 1;
  }